

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramFunction<duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
     ::
     Combine<duckdb::HistogramAggState<short,std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>>
               (HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
                *source,HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
                        *target,AggregateInputData *input_data)

{
  bool bVar1;
  map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *pmVar2;
  reference ppVar3;
  mapped_type_conflict *pmVar4;
  long *in_RSI;
  long *in_RDI;
  map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *unaff_retaddr;
  pair<const_short,_unsigned_long> *entry;
  iterator __end0;
  iterator __begin0;
  map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *__range3;
  map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *in_stack_ffffffffffffffb8;
  ArenaAllocator *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  long local_20;
  long *local_10;
  
  if (*in_RDI != 0) {
    if (*in_RSI == 0) {
      local_10 = in_RSI;
      pmVar2 = DefaultMapType<std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
               ::CreateEmpty(in_stack_ffffffffffffffc0);
      *local_10 = (long)pmVar2;
    }
    local_20 = *in_RDI;
    local_28._M_node =
         (_Base_ptr)
         ::std::
         map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    local_30._M_node =
         (_Base_ptr)
         ::std::
         map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffffb8);
    while (bVar1 = ::std::operator!=(&local_28,&local_30), bVar1) {
      ppVar3 = ::std::_Rb_tree_iterator<std::pair<const_short,_unsigned_long>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_short,_unsigned_long>_> *)
                          in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc0 = (ArenaAllocator *)ppVar3->second;
      pmVar4 = ::std::
               map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
               ::operator[](unaff_retaddr,(key_type_conflict6 *)in_RDI);
      *pmVar4 = (long)&in_stack_ffffffffffffffc0->allocator + *pmVar4;
      ::std::_Rb_tree_iterator<std::pair<const_short,_unsigned_long>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_short,_unsigned_long>_> *)
                 in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}